

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab1-1.cpp
# Opt level: O3

void SortThreeNumbers(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int tmp_1;
  int tmp;
  
  while( true ) {
    while( true ) {
      iVar1 = *a;
      iVar2 = *b;
      if (iVar1 <= iVar2) break;
      *a = iVar2;
      *b = iVar1;
    }
    if (iVar2 <= *c) break;
    *b = *c;
    *c = iVar2;
  }
  return;
}

Assistant:

void SortThreeNumbers(int *a, int *b, int *c)
{
    while (*a > *b || *b > *c) {
        if (*a > *b) {
            int tmp = *a;
            *a = *b;
            *b = tmp;
        }
        else if (*b > *c)
        {
            int tmp = *b;
            *b = *c;
            *c = tmp;
        }
        else
        {
            break;
        }
    }
}